

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

uint luckyCanonicizer_final_fast(word *pInOut,int nVars,char *pCanonPerm)

{
  word wVar1;
  uint uCanonPhase;
  int pStore [16];
  uint local_4c;
  int local_48 [16];
  
  local_4c = 0;
  if (nVars < 7) {
    wVar1 = luckyCanonicizer_final_fast_6Vars(*pInOut,local_48,pCanonPerm,&local_4c);
    *pInOut = wVar1;
  }
  else {
    if (0x10 < (uint)nVars) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast16.c"
                    ,0x343,"unsigned int luckyCanonicizer_final_fast(word *, int, char *)");
    }
    luckyCanonicizer_final_fast_16Vars
              (pInOut,nVars,1 << ((char)nVars - 6U & 0x1f),local_48,pCanonPerm,&local_4c);
  }
  return local_4c;
}

Assistant:

unsigned luckyCanonicizer_final_fast( word * pInOut, int nVars, char * pCanonPerm )
{
    int nWords;
    int pStore[16];
    unsigned uCanonPhase = 0;
#ifdef LUCKY_VERIFY
    word temp[1024] = {0};
    word duplicate[1024] = {0};
    Kit_TruthCopy_64bit( duplicate, pInOut, nVars );
#endif
    if ( nVars <= 6 )
        pInOut[0] = luckyCanonicizer_final_fast_6Vars( pInOut[0], pStore, pCanonPerm, &uCanonPhase);
    else if ( nVars <= 16 )
    {
        nWords = (nVars <= 6) ? 1 : (1 << (nVars - 6));
        luckyCanonicizer_final_fast_16Vars( pInOut, nVars, nWords, pStore, pCanonPerm, &uCanonPhase );
    }
    else assert( 0 );
#ifdef LUCKY_VERIFY
    Kit_TruthCopy_64bit( temp, pInOut, nVars );
    assert( ! luckyCheck(temp, duplicate, nVars, pCanonPerm, uCanonPhase) );
#endif
        return uCanonPhase;
}